

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall
icu_63::PluralRuleParser::parse
          (PluralRuleParser *this,UnicodeString *ruleData,PluralRules *prules,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  int8_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  OrConstraint *pOVar6;
  AndConstraint *pAVar7;
  UVector32 *pUVar8;
  RuleChain *pRVar9;
  UErrorCode *size;
  UnicodeString *src;
  bool bVar10;
  OrConstraint *local_150;
  RuleChain *local_120;
  UVector32 *local_e0;
  OrConstraint *local_d0;
  OrConstraint *orNode_1;
  undefined1 local_90 [16];
  RuleChain *insertAfter;
  undefined8 local_78;
  undefined8 local_70;
  RuleChain *newChain;
  undefined1 local_51;
  UVector32 *local_50;
  LocalPointerBase<icu_63::UVector32> local_48;
  LocalPointer<icu_63::UVector32> newRangeList;
  OrConstraint *local_30;
  OrConstraint *orNode;
  UErrorCode *status_local;
  PluralRules *prules_local;
  UnicodeString *ruleData_local;
  PluralRuleParser *this_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    this->ruleSrc = ruleData;
    do {
      iVar1 = this->ruleIndex;
      iVar4 = UnicodeString::length(this->ruleSrc);
      if (iVar4 <= iVar1) {
        return;
      }
      getNextToken(this,status);
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 != '\0') {
        return;
      }
      size = status;
      checkSyntax(this,status);
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 != '\0') {
        return;
      }
      switch(this->type) {
      case tNumber:
        if ((this->curAndConstraint->op == MOD) && (this->curAndConstraint->opNum == -1)) {
          iVar4 = getNumberValue(&this->token);
          this->curAndConstraint->opNum = iVar4;
        }
        else if (this->curAndConstraint->rangeList == (UVector32 *)0x0) {
          iVar4 = getNumberValue(&this->token);
          this->curAndConstraint->value = iVar4;
        }
        else {
          iVar4 = UVector32::elementAti(this->curAndConstraint->rangeList,this->rangeLowIdx);
          if (iVar4 == -1) {
            pUVar8 = this->curAndConstraint->rangeList;
            iVar4 = getNumberValue(&this->token);
            UVector32::setElementAt(pUVar8,iVar4,this->rangeLowIdx);
            pUVar8 = this->curAndConstraint->rangeList;
            iVar4 = getNumberValue(&this->token);
            UVector32::setElementAt(pUVar8,iVar4,this->rangeHiIdx);
          }
          else {
            pUVar8 = this->curAndConstraint->rangeList;
            iVar4 = getNumberValue(&this->token);
            UVector32::setElementAt(pUVar8,iVar4,this->rangeHiIdx);
            iVar4 = UVector32::elementAti(this->curAndConstraint->rangeList,this->rangeLowIdx);
            iVar5 = UVector32::elementAti(this->curAndConstraint->rangeList,this->rangeHiIdx);
            if (iVar5 < iVar4) {
              *status = U_FMT_PARSE_ERROR_START;
            }
          }
        }
        break;
      case tComma:
        if ((this->curAndConstraint == (AndConstraint *)0x0) ||
           (this->curAndConstraint->rangeList == (UVector32 *)0x0)) {
          *status = U_FMT_PARSE_ERROR_START;
        }
        else {
          iVar4 = UVector32::size(this->curAndConstraint->rangeList);
          this->rangeLowIdx = iVar4;
          UVector32::addElement(this->curAndConstraint->rangeList,-1,status);
          iVar4 = UVector32::size(this->curAndConstraint->rangeList);
          this->rangeHiIdx = iVar4;
          UVector32::addElement(this->curAndConstraint->rangeList,-1,status);
        }
        break;
      default:
        break;
      case tKeyword:
        pRVar9 = (RuleChain *)UMemory::operator_new((UMemory *)0xe0,(size_t)size);
        insertAfter._7_1_ = 0;
        local_120 = (RuleChain *)0x0;
        if (pRVar9 != (RuleChain *)0x0) {
          insertAfter._7_1_ = 1;
          local_78 = pRVar9;
          RuleChain::RuleChain(pRVar9);
          local_120 = pRVar9;
        }
        local_70 = local_120;
        if (local_120 == (RuleChain *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          src = &this->token;
          UnicodeString::operator=(&local_120->fKeyword,src);
          if (prules->mRules == (RuleChain *)0x0) {
            prules->mRules = (RuleChain *)local_70;
          }
          else {
            local_90._8_8_ = prules->mRules;
            while( true ) {
              bVar10 = false;
              if (*(RuleChain **)(local_90._8_8_ + 0x48) != (RuleChain *)0x0) {
                pRVar9 = *(RuleChain **)(local_90._8_8_ + 0x48);
                src = (UnicodeString *)local_90;
                ConstChar16Ptr::ConstChar16Ptr
                          ((ConstChar16Ptr *)src,(char16_t *)PLURAL_KEYWORD_OTHER);
                iVar3 = UnicodeString::compare(&pRVar9->fKeyword,(ConstChar16Ptr *)src,5);
                bVar10 = iVar3 != '\0';
                ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)local_90);
              }
              if (!bVar10) break;
              local_90._8_8_ = *(RuleChain **)(local_90._8_8_ + 0x48);
            }
            *(RuleChain **)(local_70 + 0x48) = *(RuleChain **)(local_90._8_8_ + 0x48);
            *(undefined8 *)(local_90._8_8_ + 0x48) = local_70;
          }
          pOVar6 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)src);
          local_150 = (OrConstraint *)0x0;
          if (pOVar6 != (OrConstraint *)0x0) {
            memset(pOVar6,0,0x20);
            OrConstraint::OrConstraint(pOVar6);
            local_150 = pOVar6;
          }
          if (local_150 == (OrConstraint *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            *(OrConstraint **)(local_70 + 0x50) = local_150;
            pAVar7 = OrConstraint::add(local_150,status);
            this->curAndConstraint = pAVar7;
            this->currentChain = (RuleChain *)local_70;
          }
        }
        break;
      case tAnd:
        pAVar7 = AndConstraint::add(this->curAndConstraint,status);
        this->curAndConstraint = pAVar7;
        break;
      case tOr:
        for (local_30 = this->currentChain->ruleHeader; local_30->next != (OrConstraint *)0x0;
            local_30 = local_30->next) {
        }
        pOVar6 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
        newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr._7_1_ = 0;
        local_d0 = (OrConstraint *)0x0;
        if (pOVar6 != (OrConstraint *)0x0) {
          newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr._7_1_ = 1;
          memset(pOVar6,0,0x20);
          OrConstraint::OrConstraint(pOVar6);
          local_d0 = pOVar6;
        }
        local_30->next = local_d0;
        if (local_30->next == (OrConstraint *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          pOVar6 = local_30->next;
          pOVar6->next = (OrConstraint *)0x0;
          pAVar7 = OrConstraint::add(pOVar6,status);
          this->curAndConstraint = pAVar7;
        }
        break;
      case tMod:
        this->curAndConstraint->op = MOD;
        break;
      case tNot:
        this->curAndConstraint->negated = '\x01';
        break;
      case tNotEqual:
        this->curAndConstraint->negated = '\x01';
      case tIn:
      case tEqual:
      case tWithin:
        pUVar8 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
        local_51 = 0;
        local_e0 = (UVector32 *)0x0;
        if (pUVar8 != (UVector32 *)0x0) {
          local_51 = 1;
          local_50 = pUVar8;
          UVector32::UVector32(pUVar8,status);
          local_e0 = pUVar8;
        }
        LocalPointer<icu_63::UVector32>::LocalPointer
                  ((LocalPointer<icu_63::UVector32> *)&local_48,local_e0,status);
        UVar2 = ::U_FAILURE(*status);
        if (UVar2 == '\0') {
          pUVar8 = LocalPointerBase<icu_63::UVector32>::orphan(&local_48);
          this->curAndConstraint->rangeList = pUVar8;
          UVector32::addElement(this->curAndConstraint->rangeList,-1,status);
          UVector32::addElement(this->curAndConstraint->rangeList,-1,status);
          this->rangeLowIdx = 0;
          this->rangeHiIdx = 1;
          this->curAndConstraint->value = 0x7fffffff;
          this->curAndConstraint->integerOnly = this->type != tWithin;
          newChain._0_4_ = 0;
        }
        else {
          newChain._0_4_ = 4;
        }
        LocalPointer<icu_63::UVector32>::~LocalPointer((LocalPointer<icu_63::UVector32> *)&local_48)
        ;
        break;
      case tIs:
        break;
      case tVariableN:
      case tVariableI:
      case tVariableF:
      case tVariableV:
      case tVariableT:
        this->curAndConstraint->digitsType = this->type;
        break;
      case tDecimal:
        while( true ) {
          getNextToken(this,status);
          UVar2 = ::U_FAILURE(*status);
          if (((UVar2 != '\0') || (this->type == tSemiColon)) ||
             ((this->type == tEOF || (this->type == tAt)))) break;
          if (this->type == tEllipsis) {
            this->currentChain->fDecimalSamplesUnbounded = '\x01';
          }
          else {
            UnicodeString::append(&this->currentChain->fDecimalSamples,&this->token);
          }
        }
        break;
      case tInteger:
        while( true ) {
          getNextToken(this,status);
          UVar2 = ::U_FAILURE(*status);
          if ((((UVar2 != '\0') || (this->type == tSemiColon)) || (this->type == tEOF)) ||
             (this->type == tAt)) break;
          if (this->type == tEllipsis) {
            this->currentChain->fIntegerSamplesUnbounded = '\x01';
          }
          else {
            UnicodeString::append(&this->currentChain->fIntegerSamples,&this->token);
          }
        }
      }
      this->prevType = this->type;
      UVar2 = ::U_FAILURE(*status);
    } while (UVar2 == '\0');
  }
  return;
}

Assistant:

void
PluralRuleParser::parse(const UnicodeString& ruleData, PluralRules *prules, UErrorCode &status)
{
    if (U_FAILURE(status)) {
        return;
    }
    U_ASSERT(ruleIndex == 0);    // Parsers are good for a single use only!
    ruleSrc = &ruleData;

    while (ruleIndex< ruleSrc->length()) {
        getNextToken(status);
        if (U_FAILURE(status)) {
            return;
        }
        checkSyntax(status);
        if (U_FAILURE(status)) {
            return;
        }
        switch (type) {
        case tAnd:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint = curAndConstraint->add(status);
            break;
        case tOr:
            {
                U_ASSERT(currentChain != nullptr);
                OrConstraint *orNode=currentChain->ruleHeader;
                while (orNode->next != nullptr) {
                    orNode = orNode->next;
                }
                orNode->next= new OrConstraint();
                if (orNode->next == nullptr) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                orNode=orNode->next;
                orNode->next=nullptr;
                curAndConstraint = orNode->add(status);
            }
            break;
        case tIs:
            U_ASSERT(curAndConstraint != nullptr);
            U_ASSERT(curAndConstraint->value == -1);
            U_ASSERT(curAndConstraint->rangeList == nullptr);
            break;
        case tNot:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint->negated=TRUE;
            break;

        case tNotEqual:
            curAndConstraint->negated=TRUE;
            U_FALLTHROUGH;
        case tIn:
        case tWithin:
        case tEqual:
            {
                U_ASSERT(curAndConstraint != nullptr);
                LocalPointer<UVector32> newRangeList(new UVector32(status), status);
                if (U_FAILURE(status)) {
                    break;
                }
                curAndConstraint->rangeList = newRangeList.orphan();
                curAndConstraint->rangeList->addElement(-1, status);  // range Low
                curAndConstraint->rangeList->addElement(-1, status);  // range Hi
                rangeLowIdx = 0;
                rangeHiIdx  = 1;
                curAndConstraint->value=PLURAL_RANGE_HIGH;
                curAndConstraint->integerOnly = (type != tWithin);
            }
            break;
        case tNumber:
            U_ASSERT(curAndConstraint != nullptr);
            if ( (curAndConstraint->op==AndConstraint::MOD)&&
                 (curAndConstraint->opNum == -1 ) ) {
                curAndConstraint->opNum=getNumberValue(token);
            }
            else {
                if (curAndConstraint->rangeList == nullptr) {
                    // this is for an 'is' rule
                    curAndConstraint->value = getNumberValue(token);
                } else {
                    // this is for an 'in' or 'within' rule
                    if (curAndConstraint->rangeList->elementAti(rangeLowIdx) == -1) {
                        curAndConstraint->rangeList->setElementAt(getNumberValue(token), rangeLowIdx);
                        curAndConstraint->rangeList->setElementAt(getNumberValue(token), rangeHiIdx);
                    }
                    else {
                        curAndConstraint->rangeList->setElementAt(getNumberValue(token), rangeHiIdx);
                        if (curAndConstraint->rangeList->elementAti(rangeLowIdx) >
                                curAndConstraint->rangeList->elementAti(rangeHiIdx)) {
                            // Range Lower bound > Range Upper bound.
                            // U_UNEXPECTED_TOKEN seems a little funny, but it is consistently
                            // used for all plural rule parse errors.
                            status = U_UNEXPECTED_TOKEN;
                            break;
                        }
                    }
                }
            }
            break;
        case tComma:
            // TODO: rule syntax checking is inadequate, can happen with badly formed rules.
            //       Catch cases like "n mod 10, is 1" here instead.
            if (curAndConstraint == nullptr || curAndConstraint->rangeList == nullptr) {
                status = U_UNEXPECTED_TOKEN;
                break;
            }
            U_ASSERT(curAndConstraint->rangeList->size() >= 2);
            rangeLowIdx = curAndConstraint->rangeList->size();
            curAndConstraint->rangeList->addElement(-1, status);  // range Low
            rangeHiIdx = curAndConstraint->rangeList->size();
            curAndConstraint->rangeList->addElement(-1, status);  // range Hi
            break;
        case tMod:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint->op=AndConstraint::MOD;
            break;
        case tVariableN:
        case tVariableI:
        case tVariableF:
        case tVariableT:
        case tVariableV:
            U_ASSERT(curAndConstraint != nullptr);
            curAndConstraint->digitsType = type;
            break;
        case tKeyword:
            {
            RuleChain *newChain = new RuleChain;
            if (newChain == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            newChain->fKeyword = token;
            if (prules->mRules == nullptr) {
                prules->mRules = newChain;
            } else {
                // The new rule chain goes at the end of the linked list of rule chains,
                //   unless there is an "other" keyword & chain. "other" must remain last.
                RuleChain *insertAfter = prules->mRules;
                while (insertAfter->fNext!=nullptr &&
                       insertAfter->fNext->fKeyword.compare(PLURAL_KEYWORD_OTHER, 5) != 0 ){
                    insertAfter=insertAfter->fNext;
                }
                newChain->fNext = insertAfter->fNext;
                insertAfter->fNext = newChain;
            }
            OrConstraint *orNode = new OrConstraint();
            if (orNode == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            newChain->ruleHeader = orNode;
            curAndConstraint = orNode->add(status);
            currentChain = newChain;
            }
            break;

        case tInteger:
            for (;;) {
                getNextToken(status);
                if (U_FAILURE(status) || type == tSemiColon || type == tEOF || type == tAt) {
                    break;
                }
                if (type == tEllipsis) {
                    currentChain->fIntegerSamplesUnbounded = TRUE;
                    continue;
                }
                currentChain->fIntegerSamples.append(token);
            }
            break;

        case tDecimal:
            for (;;) {
                getNextToken(status);
                if (U_FAILURE(status) || type == tSemiColon || type == tEOF || type == tAt) {
                    break;
                }
                if (type == tEllipsis) {
                    currentChain->fDecimalSamplesUnbounded = TRUE;
                    continue;
                }
                currentChain->fDecimalSamples.append(token);
            }
            break;

        default:
            break;
        }
        prevType=type;
        if (U_FAILURE(status)) {
            break;
        }
    }
}